

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrExp.c
# Opt level: O0

void Rwt_Man5ExplorePrint(void)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  char **local_60;
  int *pCounter;
  Vec_Int_t *vClassesNPN;
  Vec_Int_t *vClassesNN;
  abctime clk;
  uint uTruthC;
  uint uTruth;
  uint *pReprs;
  int *pDistrib;
  int Counter;
  int nCuts;
  int CountMax;
  int i;
  stmm_generator *gen;
  FILE *pFile;
  
  vClassesNN = (Vec_Int_t *)Abc_Clock();
  pDistrib._4_4_ = 0;
  Counter = 0;
  _CountMax = stmm_init_gen(s_pManRwrExp5->tTableNN);
  while (iVar1 = stmm_gen(_CountMax,(char **)((long)&clk + 4),(char **)&pDistrib), iVar1 != 0) {
    pDistrib._4_4_ = (uint)pDistrib + pDistrib._4_4_;
    if (Counter < (int)(uint)pDistrib) {
      Counter = (uint)pDistrib;
    }
  }
  stmm_free_gen(_CountMax);
  printf("Number of cuts considered       = %8d.\n",(ulong)pDistrib._4_4_);
  printf("Classes occurring at least once = %8d.\n",
         (ulong)(uint)s_pManRwrExp5->tTableNN->num_entries);
  printf("The largest number of occurence = %8d.\n");
  pReprs = (uint *)malloc((long)(Counter + 1) << 2);
  _uTruthC = malloc((long)(Counter + 1) << 2);
  memset(pReprs,0,(long)(Counter + 1) << 2);
  _CountMax = stmm_init_gen(s_pManRwrExp5->tTableNN);
  while( true ) {
    iVar1 = stmm_gen(_CountMax,(char **)((long)&clk + 4),(char **)&pDistrib);
    if (iVar1 == 0) {
      stmm_free_gen(_CountMax);
      for (nCuts = 1; nCuts <= Counter; nCuts = nCuts + 1) {
        if (pReprs[nCuts] != 0) {
          printf("Occurence = %6d.  Num classes = %4d.  Repr = ",(ulong)(uint)nCuts,
                 (ulong)pReprs[nCuts]);
          Extra_PrintBinary(_stdout,(uint *)((long)_uTruthC + (long)nCuts * 4),0x20);
          printf("\n");
        }
      }
      if (pReprs != (uint *)0x0) {
        free(pReprs);
        pReprs = (uint *)0x0;
      }
      if (_uTruthC != (void *)0x0) {
        free(_uTruthC);
        _uTruthC = (void *)0x0;
      }
      vClassesNPN = Vec_IntAlloc(s_pManRwrExp5->tTableNN->num_entries);
      _CountMax = stmm_init_gen(s_pManRwrExp5->tTableNN);
      while (iVar1 = stmm_gen(_CountMax,(char **)((long)&clk + 4),(char **)0x0), iVar1 != 0) {
        Vec_IntPush(vClassesNPN,clk._4_4_);
      }
      stmm_free_gen(_CountMax);
      Vec_IntSortUnsigned(vClassesNPN);
      gen = (stmm_generator *)fopen("nnclass_stats5.txt","w");
      for (nCuts = 0; iVar1 = nCuts, iVar2 = Vec_IntSize(vClassesNPN), iVar1 < iVar2;
          nCuts = nCuts + 1) {
        clk._4_4_ = Vec_IntEntry(vClassesNPN,nCuts);
        iVar1 = stmm_lookup(s_pManRwrExp5->tTableNN,(char *)(ulong)clk._4_4_,(char **)&pDistrib);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/rwr/rwrExp.c"
                        ,0x117,"void Rwt_Man5ExplorePrint()");
        }
        Extra_PrintHex((FILE *)gen,(uint *)((long)&clk + 4),5);
        fprintf((FILE *)gen," %10d\n",(ulong)(uint)pDistrib);
      }
      fclose((FILE *)gen);
      printf("%d classes written into file \"%s\".\n",(ulong)(uint)vClassesNPN->nSize,
             "nnclass_stats5.txt");
      vClassesNN = (Vec_Int_t *)Abc_Clock();
      nCuts = 0;
      while( true ) {
        iVar1 = nCuts;
        iVar2 = Vec_IntSize(vClassesNPN);
        if (iVar2 <= iVar1) {
          printf("The numbe of NPN classes = %d.\n",
                 (ulong)(uint)s_pManRwrExp5->tTableNPN->num_entries);
          Abc_Print(1,"%s =","Computing NPN classes");
          aVar3 = Abc_Clock();
          Abc_Print(1,"%9.2f sec\n",((double)(aVar3 - (long)vClassesNN) * 1.0) / 1000000.0);
          pCounter = &Vec_IntAlloc(s_pManRwrExp5->tTableNPN->num_entries)->nCap;
          _CountMax = stmm_init_gen(s_pManRwrExp5->tTableNPN);
          while (iVar1 = stmm_gen(_CountMax,(char **)((long)&clk + 4),(char **)0x0), iVar1 != 0) {
            Vec_IntPush((Vec_Int_t *)pCounter,clk._4_4_);
          }
          stmm_free_gen(_CountMax);
          Vec_IntSortUnsigned((Vec_Int_t *)pCounter);
          gen = (stmm_generator *)fopen("npnclass_stats5.txt","w");
          nCuts = 0;
          while( true ) {
            iVar1 = nCuts;
            iVar2 = Vec_IntSize((Vec_Int_t *)pCounter);
            if (iVar2 <= iVar1) {
              fclose((FILE *)gen);
              printf("%d classes written into file \"%s\".\n",(ulong)(uint)pCounter[1],
                     "npnclass_stats5.txt");
              return;
            }
            clk._4_4_ = Vec_IntEntry((Vec_Int_t *)pCounter,nCuts);
            iVar1 = stmm_lookup(s_pManRwrExp5->tTableNPN,(char *)(ulong)clk._4_4_,(char **)&pDistrib
                               );
            if (iVar1 == 0) break;
            Extra_PrintHex((FILE *)gen,(uint *)((long)&clk + 4),5);
            fprintf((FILE *)gen," %10d\n",(ulong)(uint)pDistrib);
            nCuts = nCuts + 1;
          }
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/rwr/rwrExp.c"
                        ,0x13d,"void Rwt_Man5ExplorePrint()");
        }
        clk._4_4_ = Vec_IntEntry(vClassesNPN,nCuts);
        clk._0_4_ = Extra_TruthCanonNPN(clk._4_4_,5);
        iVar1 = stmm_find_or_add(s_pManRwrExp5->tTableNPN,(char *)(ulong)(uint)clk,&local_60);
        if (iVar1 == 0) {
          *(int *)local_60 = 0;
        }
        iVar1 = stmm_lookup(s_pManRwrExp5->tTableNN,(char *)(ulong)clk._4_4_,(char **)&pDistrib);
        if (iVar1 == 0) break;
        *(uint *)local_60 = (uint)pDistrib + *(int *)local_60;
        nCuts = nCuts + 1;
      }
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/rwr/rwrExp.c"
                    ,0x12a,"void Rwt_Man5ExplorePrint()");
    }
    if (Counter < (int)(uint)pDistrib) break;
    pReprs[(int)(uint)pDistrib] = pReprs[(int)(uint)pDistrib] + 1;
    *(uint *)((long)_uTruthC + (long)(int)(uint)pDistrib * 4) = clk._4_4_;
  }
  __assert_fail("Counter <= CountMax",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/rwr/rwrExp.c"
                ,0xfb,"void Rwt_Man5ExplorePrint()");
}

Assistant:

void Rwt_Man5ExplorePrint()
{
    FILE * pFile;
    stmm_generator * gen;
    int i, CountMax, nCuts, Counter;
    int * pDistrib;
    unsigned * pReprs;
    unsigned uTruth, uTruthC;
    abctime clk = Abc_Clock();
    Vec_Int_t * vClassesNN, * vClassesNPN;

    // find the max number of occurences
    nCuts = 0;
    CountMax = 0;
    stmm_foreach_item( s_pManRwrExp5->tTableNN, gen, (char **)&uTruth, (char **)&Counter )
    {
        nCuts += Counter;
        if ( CountMax < Counter )
            CountMax = Counter;
    }
    printf( "Number of cuts considered       = %8d.\n", nCuts );
    printf( "Classes occurring at least once = %8d.\n", stmm_count(s_pManRwrExp5->tTableNN) );
    printf( "The largest number of occurence = %8d.\n", CountMax );

    // print the distribution of classes
    pDistrib = ABC_ALLOC( int, CountMax + 1 );
    pReprs   = ABC_ALLOC( unsigned, CountMax + 1 );
    memset( pDistrib, 0, sizeof(int)*(CountMax + 1) );
    stmm_foreach_item( s_pManRwrExp5->tTableNN, gen, (char **)&uTruth, (char **)&Counter )
    {
        assert( Counter <= CountMax );
        pDistrib[ Counter ]++;
        pReprs[ Counter ] = uTruth;
    }

    for ( i = 1; i <= CountMax; i++ )
        if ( pDistrib[i] )
        {
            printf( "Occurence = %6d.  Num classes = %4d.  Repr = ", i, pDistrib[i] );
            Extra_PrintBinary( stdout, pReprs + i, 32 ); 
            printf( "\n" );
        }
    ABC_FREE( pDistrib );
    ABC_FREE( pReprs );


    // put them into an array
    vClassesNN = Vec_IntAlloc( stmm_count(s_pManRwrExp5->tTableNN) );
    stmm_foreach_item( s_pManRwrExp5->tTableNN, gen, (char **)&uTruth, NULL )
        Vec_IntPush( vClassesNN, (int)uTruth );
    Vec_IntSortUnsigned( vClassesNN );

    // write into a file all classes
    pFile = fopen( "nnclass_stats5.txt", "w" );
    Vec_IntForEachEntry( vClassesNN, uTruth, i )
    {
        if ( !stmm_lookup( s_pManRwrExp5->tTableNN, (char *)(ABC_PTRUINT_T)uTruth, (char **)&Counter ) )
        {
            assert( 0 );
        }
        Extra_PrintHex( pFile, &uTruth, 5 );
        fprintf( pFile, " %10d\n", Counter );
    }
    fclose( pFile );
    printf( "%d classes written into file \"%s\".\n", vClassesNN->nSize, "nnclass_stats5.txt" );


clk = Abc_Clock();
    // how many NPN classes exist?
    Vec_IntForEachEntry( vClassesNN, uTruth, i )
    {
        int * pCounter;
        uTruthC = Extra_TruthCanonNPN( uTruth, 5 );
        if ( !stmm_find_or_add( s_pManRwrExp5->tTableNPN, (char *)(ABC_PTRUINT_T)uTruthC, (char***)&pCounter ) )
            *pCounter = 0;
        if ( !stmm_lookup( s_pManRwrExp5->tTableNN, (char *)(ABC_PTRUINT_T)uTruth, (char **)&Counter ) )
        {
            assert( 0 );
        }
        (*pCounter) += Counter;
    }
    printf( "The numbe of NPN classes = %d.\n", stmm_count(s_pManRwrExp5->tTableNPN) );
ABC_PRT( "Computing NPN classes", Abc_Clock() - clk );

    // put them into an array
    vClassesNPN = Vec_IntAlloc( stmm_count(s_pManRwrExp5->tTableNPN) );
    stmm_foreach_item( s_pManRwrExp5->tTableNPN, gen, (char **)&uTruth, NULL )
        Vec_IntPush( vClassesNPN, (int)uTruth );
    Vec_IntSortUnsigned( vClassesNPN );

    // write into a file all classes
    pFile = fopen( "npnclass_stats5.txt", "w" );
    Vec_IntForEachEntry( vClassesNPN, uTruth, i )
    {
        if ( !stmm_lookup( s_pManRwrExp5->tTableNPN, (char *)(ABC_PTRUINT_T)uTruth, (char **)&Counter ) )
        {
            assert( 0 );
        }
        Extra_PrintHex( pFile, &uTruth, 5 );
        fprintf( pFile, " %10d\n", Counter );
    }
    fclose( pFile );
    printf( "%d classes written into file \"%s\".\n", vClassesNPN->nSize, "npnclass_stats5.txt" );


    // can they be uniquely characterized?

}